

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeIfe
          (InstructionCreater *this,Node *node,Element *refelt)

{
  reference element;
  reference elt;
  reference elt_00;
  JumpNot *this_00;
  Jump *this_01;
  size_t sVar1;
  Element EVar2;
  Jump *instje;
  JumpNot *inst;
  Element *E2;
  Element *E1;
  Element *Bexp;
  Element *refelt_local;
  Node *node_local;
  InstructionCreater *this_local;
  
  element = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::operator[]
                      (&node->
                        super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,
                       1);
  elt = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::operator[]
                  (&node->
                    super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,2);
  elt_00 = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::operator[]
                     (&node->
                       super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,3
                     );
  createReferNode(this,element);
  this_00 = (JumpNot *)operator_new(0x28);
  *(undefined8 *)&this_00->Data = 0;
  (this_00->Data).index = 0;
  (this_00->super_InstDataBase<(ICM::Instruction::Instruction)32>).super_InstructionData.
  _vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)
   &(this_00->super_InstDataBase<(ICM::Instruction::Instruction)32>).super_InstructionData.Inst = 0;
  this_00->Index = 0;
  Instruction::Insts::JumpNot::JumpNot(this_00);
  EVar2 = Instruction::ConvertToInstElement(element);
  *(ulong *)&this_00->Data = CONCAT44(instje._4_4_,EVar2.field_0.type);
  (this_00->Data).index = EVar2.index;
  Instruction::InstructionList::push(&this->InstList,(InstructionData *)this_00);
  createReferNodeAndSingleElement(this,elt);
  this_01 = (Jump *)operator_new(0x18);
  (this_01->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
  _vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst = 0;
  this_01->Index = 0;
  Instruction::Insts::Jump::Jump(this_01);
  Instruction::InstructionList::push(&this->InstList,(InstructionData *)this_01);
  sVar1 = NextInstID(this);
  this_00->Index = sVar1;
  createReferNodeAndSingleElement(this,elt_00);
  sVar1 = NextInstID(this);
  this_01->Index = sVar1;
  Instruction::InstructionList::push(&this->InstList,sing);
  sVar1 = CurrInstID(this);
  ASTBase::Element::setRefer(refelt,sVar1);
  return true;
}

Assistant:

bool createNodeIfe(Node &node, Element &refelt) {
				Element &Bexp = node[1];
				Element &E1 = node[2];
				Element &E2 = node[3];

				createReferNode(Bexp);

				auto *inst = new Insts::JumpNot();
				inst->Data = ConvertToInstElement(Bexp);
				InstList.push(inst);

				createReferNodeAndSingleElement(E1);


				auto *instje = new Insts::Jump();
				InstList.push(instje);
				inst->Index = NextInstID();

				createReferNodeAndSingleElement(E2);

				instje->Index = NextInstID();

				InstList.push(sing);

				refelt.setRefer(CurrInstID());
				return true;
			}